

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O2

uint32_t __thiscall
cppnet::BufferBlock::Write(BufferBlock *this,shared_ptr<cppnet::InnerBuffer> *buffer,uint32_t len)

{
  char *pcVar1;
  _func_int *p_Var2;
  element_type *peVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  void *data1;
  void *data2;
  uint32_t len2;
  uint32_t len1;
  shared_ptr<cppnet::BufferBlock> block_buffer;
  void *local_60;
  shared_ptr<cppnet::InnerBuffer> *local_58;
  void *local_50;
  uint32_t local_48;
  uint32_t local_44;
  shared_ptr<cppnet::InnerBuffer> local_40;
  
  if (len == 0) {
    len = (*(((buffer->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
            ->super_Buffer)._vptr_Buffer[8])();
  }
  pcVar1 = this->_buffer_start;
  if (pcVar1 == (char *)0x0) {
    return 0;
  }
  if ((this->_can_read == false) && (this->_read == this->_write)) {
    this->_read = pcVar1;
    this->_write = pcVar1;
  }
  local_60 = (void *)0x0;
  local_50 = (void *)0x0;
  local_44 = 0;
  local_48 = 0;
  local_58 = buffer;
  std::dynamic_pointer_cast<cppnet::BufferBlock,cppnet::InnerBuffer>(&local_40);
  GetUseMemoryBlock((BufferBlock *)
                    local_40.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr,&local_60,&local_44,&local_50,&local_48);
  uVar7 = (ulong)local_48;
  if (len < local_48 + local_44) {
    p_Var2 = (this->super_InnerBuffer).super_Buffer._vptr_Buffer[10];
    uVar6 = len - local_44;
    if (len < local_44) {
      uVar6 = (*p_Var2)(this,local_60,(ulong)len);
      goto LAB_00114c5f;
    }
    iVar4 = (*p_Var2)(this,local_60);
    iVar5 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(this,local_50,(ulong)uVar6);
  }
  else {
    iVar4 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(this,local_60);
    iVar5 = (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[10])(this,local_50,uVar7);
  }
  uVar6 = iVar5 + iVar4;
LAB_00114c5f:
  peVar3 = (local_58->super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*(peVar3->super_Buffer)._vptr_Buffer[6])(peVar3,(ulong)uVar6);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<cppnet::InnerBuffer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return uVar6;
}

Assistant:

uint32_t BufferBlock::Write(std::shared_ptr<InnerBuffer> buffer, uint32_t len) {
    if (len == 0) {
        len = buffer->GetCanReadLength();
    }

    if (!_buffer_start) {
        return 0;
    }

    if(!_can_read && _read == _write) {
        _write = _read = _buffer_start;
    }

    void* data1 = nullptr, *data2 = nullptr;
    uint32_t len1 = 0, len2 = 0;

    std::shared_ptr<BufferBlock> block_buffer = std::dynamic_pointer_cast<BufferBlock>(buffer);
    block_buffer->GetUseMemoryBlock(data1, len1, data2, len2);
    uint32_t total_size = len1 + len2;
    uint32_t write_done_size = 0;
    
    // write all data
    if (len >= total_size) {
        write_done_size += Write((char*)data1, len1);
        write_done_size += Write((char*)data2, len2);

    // write part of data
    } else if (len < total_size && len >= len1) {
        write_done_size += Write((char*)data1, len1);
        write_done_size += Write((char*)data2, len - len1);

    // write part of data
    } else {
        write_done_size += Write((char*)data1, len);
    }

    buffer->MoveReadPt(write_done_size);
    return write_done_size;
}